

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::benchmarkEnded
          (ConsoleReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *stats)

{
  TablePrinter *tp;
  int iVar1;
  Duration local_78;
  Duration local_68;
  Duration local_58;
  Duration local_48;
  Duration local_38;
  Duration local_28;
  
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x15])();
  tp = (this->m_tablePrinter)._M_t.
       super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>._M_t.
       super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>.
       super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
  if ((char)iVar1 == '\0') {
    operator<<(tp);
    local_78.m_inNanoseconds = (stats->mean).point.__r;
    local_28.m_units = Nanoseconds;
    local_78.m_units = Nanoseconds;
    if (((1000.0 <= local_78.m_inNanoseconds) &&
        (local_78.m_units = Microseconds, 1000000.0 <= local_78.m_inNanoseconds)) &&
       (local_78.m_units = Milliseconds, 1000000000.0 <= local_78.m_inNanoseconds)) {
      local_78.m_units = local_78.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_78);
    operator<<(tp);
    local_28.m_inNanoseconds = (stats->mean).lower_bound.__r;
    if (((1000.0 <= local_28.m_inNanoseconds) &&
        (local_28.m_units = Microseconds, 1000000.0 <= local_28.m_inNanoseconds)) &&
       (local_28.m_units = Milliseconds, 1000000000.0 <= local_28.m_inNanoseconds)) {
      local_28.m_units = local_28.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_28);
    operator<<(tp);
    local_38.m_inNanoseconds = (stats->mean).upper_bound.__r;
    local_48.m_units = Nanoseconds;
    local_38.m_units = Nanoseconds;
    if (((1000.0 <= local_38.m_inNanoseconds) &&
        (local_38.m_units = Microseconds, 1000000.0 <= local_38.m_inNanoseconds)) &&
       (local_38.m_units = Milliseconds, 1000000000.0 <= local_38.m_inNanoseconds)) {
      local_38.m_units = local_38.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_38);
    operator<<(tp);
    operator<<(tp);
    local_48.m_inNanoseconds = (stats->standardDeviation).point.__r;
    if (((1000.0 <= local_48.m_inNanoseconds) &&
        (local_48.m_units = Microseconds, 1000000.0 <= local_48.m_inNanoseconds)) &&
       (local_48.m_units = Milliseconds, 1000000000.0 <= local_48.m_inNanoseconds)) {
      local_48.m_units = local_48.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_48);
    operator<<(tp);
    local_58.m_inNanoseconds = (stats->standardDeviation).lower_bound.__r;
    local_68.m_units = Nanoseconds;
    local_58.m_units = Nanoseconds;
    if (((1000.0 <= local_58.m_inNanoseconds) &&
        (local_58.m_units = Microseconds, 1000000.0 <= local_58.m_inNanoseconds)) &&
       (local_58.m_units = Milliseconds, 1000000000.0 <= local_58.m_inNanoseconds)) {
      local_58.m_units = local_58.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_58);
    operator<<(tp);
    local_68.m_inNanoseconds = (stats->standardDeviation).upper_bound.__r;
    if (((1000.0 <= local_68.m_inNanoseconds) &&
        (local_68.m_units = Microseconds, 1000000.0 <= local_68.m_inNanoseconds)) &&
       (local_68.m_units = Milliseconds, 1000000000.0 <= local_68.m_inNanoseconds)) {
      local_68.m_units = local_68.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_68);
    operator<<(tp);
    operator<<(tp);
    operator<<(tp);
    operator<<(tp);
  }
  else {
    local_78.m_inNanoseconds = (stats->mean).point.__r;
    local_78.m_units = Nanoseconds;
    if (((1000.0 <= local_78.m_inNanoseconds) &&
        (local_78.m_units = Microseconds, 1000000.0 <= local_78.m_inNanoseconds)) &&
       (local_78.m_units = Milliseconds, 1000000000.0 <= local_78.m_inNanoseconds)) {
      local_78.m_units = local_78.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    operator<<(tp,&local_78);
  }
  operator<<(tp);
  return;
}

Assistant:

void ConsoleReporter::benchmarkEnded(BenchmarkStats<> const& stats) {
    if (m_config->benchmarkNoAnalysis())
    {
        (*m_tablePrinter) << Duration(stats.mean.point.count()) << ColumnBreak();
    }
    else
    {
        (*m_tablePrinter) << ColumnBreak()
            << Duration(stats.mean.point.count()) << ColumnBreak()
            << Duration(stats.mean.lower_bound.count()) << ColumnBreak()
            << Duration(stats.mean.upper_bound.count()) << ColumnBreak() << ColumnBreak()
            << Duration(stats.standardDeviation.point.count()) << ColumnBreak()
            << Duration(stats.standardDeviation.lower_bound.count()) << ColumnBreak()
            << Duration(stats.standardDeviation.upper_bound.count()) << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak();
    }
}